

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.cpp
# Opt level: O3

void libtorrent::aux::append_utf8_codepoint(string *ret,int32_t codepoint)

{
  int iVar1;
  char cVar2;
  
  if ((codepoint & 0xfffff800U) == 0xd800) {
    codepoint = 0x5f;
  }
  if (0x10ffff < codepoint) {
    codepoint = 0x5f;
  }
  cVar2 = (char)ret;
  if (codepoint < 0x80) {
    ::std::__cxx11::string::push_back(cVar2);
    return;
  }
  iVar1 = 0;
  if (0x7ff < (uint)codepoint) {
    iVar1 = 2 - (uint)((uint)codepoint < 0x10000);
  }
  ::std::__cxx11::string::push_back(cVar2);
  iVar1 = iVar1 * 6;
  do {
    ::std::__cxx11::string::push_back(cVar2);
    iVar1 = iVar1 + -6;
  } while (iVar1 != -6);
  return;
}

Assistant:

void append_utf8_codepoint(std::string& ret, std::int32_t codepoint)
	{
		if (codepoint >= surrogate_start
			&& codepoint <= surrogate_end)
			codepoint = '_';

		if (codepoint > max_codepoint)
			codepoint = '_';

		int seq_len = 0;
		if (codepoint < 0x80) seq_len = 1;
		else if (codepoint < 0x800) seq_len = 2;
		else if (codepoint < 0x10000) seq_len = 3;
		else seq_len = 4;

		switch (seq_len)
		{
			case 1:
				ret.push_back(static_cast<char>(codepoint));
				break;
			case 2:
				ret.push_back(static_cast<char>(0b11000000 | (codepoint >> 6)));
				break;
			case 3:
				ret.push_back(static_cast<char>(0b11100000 | (codepoint >> 12)));
				break;
			case 4:
				ret.push_back(static_cast<char>(0b11110000 | (codepoint >> 18)));
				break;
		}

		for (int i = seq_len - 2; i >= 0; --i)
			ret.push_back(static_cast<char>(0b10000000 | ((codepoint >> (6 * i)) & 0b111111)));
	}